

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

container_t *
convert_to_bitset_or_array_container(run_container_t *rc,int32_t card,uint8_t *resulttype)

{
  ushort uVar1;
  int iVar2;
  rle16_t *prVar3;
  uint16_t *puVar4;
  ulong uVar5;
  int iVar6;
  array_container_t *paVar7;
  uint8_t uVar8;
  uint uVar9;
  long lVar10;
  ushort uVar11;
  uint uVar12;
  ushort uVar13;
  ushort *puVar14;
  uint uVar15;
  
  if (card < 0x1001) {
    paVar7 = array_container_create_given_capacity(card);
    paVar7->cardinality = 0;
    iVar2 = rc->n_runs;
    if ((long)iVar2 < 1) {
      iVar6 = 0;
    }
    else {
      prVar3 = rc->runs;
      iVar6 = 0;
      lVar10 = 0;
      do {
        uVar11 = prVar3[lVar10].value;
        uVar1 = prVar3[lVar10].length;
        uVar13 = uVar1 + uVar11;
        if (!CARRY2(uVar1,uVar11)) {
          puVar14 = paVar7->array + iVar6;
          do {
            *puVar14 = uVar11;
            uVar11 = uVar11 + 1;
            puVar14 = puVar14 + 1;
            iVar6 = iVar6 + 1;
          } while (uVar11 <= uVar13);
          paVar7->cardinality = iVar6;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != iVar2);
    }
    uVar8 = '\x02';
    if (iVar6 != card) {
      __assert_fail("card == answer->cardinality",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x2de6,
                    "container_t *convert_to_bitset_or_array_container(run_container_t *, int32_t, uint8_t *)"
                   );
    }
  }
  else {
    paVar7 = (array_container_t *)bitset_container_create();
    iVar2 = rc->n_runs;
    if (0 < (long)iVar2) {
      prVar3 = rc->runs;
      puVar4 = paVar7->array;
      lVar10 = 0;
      do {
        uVar11 = prVar3[lVar10].value;
        uVar1 = prVar3[lVar10].length;
        uVar15 = (uint)uVar1 + (uint)uVar11;
        uVar9 = (uint)(uVar11 >> 6);
        uVar12 = uVar15 >> 6;
        if (uVar12 - uVar9 == 0) {
          *(ulong *)(puVar4 + (ulong)uVar9 * 4) =
               *(ulong *)(puVar4 + (ulong)uVar9 * 4) |
               (0xffffffffffffffffU >> (0x3fU - (char)uVar1 & 0x3f)) << ((byte)uVar11 & 0x3f);
        }
        else {
          uVar5 = *(ulong *)(puVar4 + (ulong)uVar12 * 4);
          *(ulong *)(puVar4 + (ulong)uVar9 * 4) =
               *(ulong *)(puVar4 + (ulong)uVar9 * 4) | -1L << ((byte)uVar11 & 0x3f);
          if (uVar9 + 1 < uVar12) {
            memset(puVar4 + (ulong)(uVar11 >> 6) * 4 + 4,0xff,
                   (ulong)((uVar12 - uVar9) - 2 >> 1) * 0x10 + 0x10);
          }
          *(ulong *)(puVar4 + (ulong)uVar12 * 4) =
               uVar5 | 0xffffffffffffffffU >> (~(byte)uVar15 & 0x3f);
        }
        lVar10 = lVar10 + 1;
      } while (iVar2 != lVar10);
    }
    paVar7->cardinality = card;
    uVar8 = '\x01';
  }
  *resulttype = uVar8;
  return paVar7;
}

Assistant:

container_t *convert_to_bitset_or_array_container(
    run_container_t *rc, int32_t card,
    uint8_t *resulttype
){
    if (card <= DEFAULT_MAX_SIZE) {
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int rlepos = 0; rlepos < rc->n_runs; ++rlepos) {
            uint16_t run_start = rc->runs[rlepos].value;
            uint16_t run_end = run_start + rc->runs[rlepos].length;
            for (uint16_t run_value = run_start; run_value <= run_end;
                 ++run_value) {
                answer->array[answer->cardinality++] = run_value;
            }
        }
        assert(card == answer->cardinality);
        *resulttype = ARRAY_CONTAINER_TYPE;
        //run_container_free(r);
        return answer;
    }
    bitset_container_t *answer = bitset_container_create();
    for (int rlepos = 0; rlepos < rc->n_runs; ++rlepos) {
        uint16_t run_start = rc->runs[rlepos].value;
        bitset_set_lenrange(answer->words, run_start, rc->runs[rlepos].length);
    }
    answer->cardinality = card;
    *resulttype = BITSET_CONTAINER_TYPE;
    //run_container_free(r);
    return answer;
}